

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

count * lest::for_test<lest::count>(tests *specification,texts *in,count *perform,int n)

{
  count *this;
  bool bVar1;
  uint uVar2;
  int in_ECX;
  fd_set *__exceptfds;
  count *in_RDX;
  fd_set *__writefds;
  timeval *in_R8;
  test *testing;
  iterator pos;
  int i;
  test *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff17;
  test *in_stack_ffffffffffffff20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  undefined1 local_80 [56];
  reference local_48;
  test *local_40;
  test *local_38;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> local_30;
  int local_28;
  int local_24;
  count *local_20;
  
  local_28 = 0;
  local_24 = in_ECX;
  local_20 = in_RDX;
  do {
    uVar2 = indefinite(local_24);
    __exceptfds = (fd_set *)(ulong)uVar2;
    if (uVar2 == 0 && local_24 <= local_28) {
      return local_20;
    }
    local_38 = (test *)std::vector<lest::test,_std::allocator<lest::test>_>::begin
                                 ((vector<lest::test,_std::allocator<lest::test>_> *)
                                  in_stack_ffffffffffffff08);
    local_30._M_current = local_38;
    while( true ) {
      local_40 = (test *)std::vector<lest::test,_std::allocator<lest::test>_>::end
                                   ((vector<lest::test,_std::allocator<lest::test>_> *)
                                    in_stack_ffffffffffffff08);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                         (__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)in_stack_ffffffffffffff08);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                 ::operator*(&local_30);
      std::__cxx11::string::string((string *)(local_80 + 0x18),(string *)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      uVar2 = select((int)local_80 + 0x18,(fd_set *)local_80,__writefds,__exceptfds,in_R8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff20);
      std::__cxx11::string::~string((string *)(local_80 + 0x18));
      this = local_20;
      if ((uVar2 & 1) != 0) {
        in_stack_ffffffffffffff20 = (test *)&stack0xffffffffffffff48;
        test::test((test *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        count::operator()(this,in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff17 = abort<lest::count>((count *)0x108453);
        test::~test((test *)0x108463);
        if ((in_stack_ffffffffffffff17 & 1) != 0) {
          return local_20;
        }
      }
      __gnu_cxx::
      __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>::
      operator++(&local_30);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}